

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharScanner.hpp
# Opt level: O2

int __thiscall antlr::CharScanner::testLiteralsTable(CharScanner *this,int ttype)

{
  const_iterator cVar1;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_antlr::CharScannerLiteralsLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(&(this->literals)._M_t,&this->text);
  if ((_Rb_tree_header *)cVar1._M_node != &(this->literals)._M_t._M_impl.super__Rb_tree_header) {
    ttype = cVar1._M_node[2]._M_color;
  }
  return ttype;
}

Assistant:

virtual int testLiteralsTable(int ttype) const
	{
		ANTLR_USE_NAMESPACE(std)map<ANTLR_USE_NAMESPACE(std)string,int,CharScannerLiteralsLess>::const_iterator i = literals.find(text);
		if (i != literals.end())
			ttype = (*i).second;
		return ttype;
	}